

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdGetString(EpDouble *epd,char *str)

{
  int iVar1;
  char *pcVar2;
  char *pos;
  double dStack_20;
  int exponent;
  double value;
  char *str_local;
  EpDouble *epd_local;
  
  value = (double)str;
  str_local = (char *)epd;
  iVar1 = IsNanDouble((epd->type).value);
  if (iVar1 == 0) {
    iVar1 = IsInfDouble(*(double *)str_local);
    if (iVar1 == 0) {
      if ((((uint)((ulong)*(undefined8 *)str_local >> 0x34) & 0x7ff) != 0x3ff) &&
         ((*(ulong *)str_local >> 0x34 & 0x7ff) != 0)) {
        __assert_fail("epd->type.bits.exponent == EPD_MAX_BIN || epd->type.bits.exponent == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/epd/epd.c"
                      ,0x99,"void EpdGetString(EpDouble *, char *)");
      }
      EpdGetValueAndDecimalExponent
                ((EpDouble *)str_local,&stack0xffffffffffffffe0,(int *)((long)&pos + 4));
      sprintf((char *)value,"%e",dStack_20);
      pcVar2 = strstr((char *)value,"e");
      if ((int)pos._4_4_ < 0) {
        pos._4_4_ = -pos._4_4_;
        if ((int)pos._4_4_ < 10) {
          sprintf(pcVar2 + 1,"-0%d",(ulong)pos._4_4_);
        }
        else {
          sprintf(pcVar2 + 1,"-%d",(ulong)pos._4_4_);
        }
      }
      else if ((int)pos._4_4_ < 10) {
        sprintf(pcVar2 + 1,"+0%d",(ulong)pos._4_4_);
      }
      else {
        sprintf(pcVar2 + 1,"+%d",(ulong)pos._4_4_);
      }
    }
    else if (*(long *)str_local < 0) {
      sprintf((char *)value,"-Inf");
    }
    else {
      sprintf((char *)value,"Inf");
    }
  }
  else {
    sprintf((char *)value,"NaN");
  }
  return;
}

Assistant:

void
EpdGetString(EpDouble *epd, char *str)
{
  double        value;
  int           exponent;
  char          *pos;

  if (IsNanDouble(epd->type.value)) {
    sprintf(str, "NaN");
    return;
  } else if (IsInfDouble(epd->type.value)) {
    if (epd->type.bits.sign == 1)
      sprintf(str, "-Inf");
    else
      sprintf(str, "Inf");
    return;
  }

  assert(epd->type.bits.exponent == EPD_MAX_BIN ||
         epd->type.bits.exponent == 0);

  EpdGetValueAndDecimalExponent(epd, &value, &exponent);
  sprintf(str, "%e", value);
  pos = strstr(str, "e");
  if (exponent >= 0) {
    if (exponent < 10)
      sprintf(pos + 1, "+0%d", exponent);
    else
      sprintf(pos + 1, "+%d", exponent);
  } else {
    exponent *= -1;
    if (exponent < 10)
      sprintf(pos + 1, "-0%d", exponent);
    else
      sprintf(pos + 1, "-%d", exponent);
  }
}